

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O0

Var Js::StringToVar(char *src,uint length,void *user_data)

{
  code *pcVar1;
  bool bVar2;
  char16 *content;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  char16 *buf;
  size_t slength;
  void *pvStack_28;
  charcount_t bufSize;
  Context *ctx;
  void *user_data_local;
  char *pcStack_10;
  uint length_local;
  char *src_local;
  
  slength._4_4_ = 0;
  buf = (char16 *)(ulong)length;
  pvStack_28 = user_data;
  ctx = (Context *)user_data;
  user_data_local._4_4_ = length;
  pcStack_10 = src;
  content = NarrowStringToWide((Context *)user_data,src,(size_t *)&buf,
                               (charcount_t *)((long)&slength + 4));
  if (slength._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x5c,"(bufSize < (4294967295U))","bufSize < UINT32_MAX");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = JavascriptString::NewCopyBuffer
                     (content,slength._4_4_,*(ScriptContext **)((long)pvStack_28 + 8));
  return pJVar4;
}

Assistant:

Js::Var StringToVar(const char* src, uint length, void* user_data)
{
    Context* ctx = (Context*)user_data;
    charcount_t bufSize = 0;
    size_t slength = (size_t)length;
    char16* buf = NarrowStringToWide(ctx, src, &slength, &bufSize);
    Assert(bufSize < UINT32_MAX);
    return JavascriptString::NewCopyBuffer(buf, bufSize, ctx->scriptContext);
}